

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O1

bool __thiscall blc::network::SSLSocket::writable(SSLSocket *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  timeval timeout;
  fd_set fds;
  timeval local_98;
  fd_set local_88;
  
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  if (this->_opened == false) {
    bVar1 = false;
  }
  else {
    local_88.fds_bits[0xe] = 0;
    local_88.fds_bits[0xf] = 0;
    local_88.fds_bits[0xc] = 0;
    local_88.fds_bits[0xd] = 0;
    local_88.fds_bits[10] = 0;
    local_88.fds_bits[0xb] = 0;
    local_88.fds_bits[8] = 0;
    local_88.fds_bits[9] = 0;
    local_88.fds_bits[6] = 0;
    local_88.fds_bits[7] = 0;
    local_88.fds_bits[4] = 0;
    local_88.fds_bits[5] = 0;
    local_88.fds_bits[2] = 0;
    local_88.fds_bits[3] = 0;
    local_88.fds_bits[0] = 0;
    local_88.fds_bits[1] = 0;
    iVar3 = *(int *)&(this->super_Socket).field_0x44;
    iVar2 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar2 = iVar3;
    }
    local_88.fds_bits[iVar2 >> 6] =
         local_88.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
    iVar3 = select(iVar3 + 1,(fd_set *)0x0,&local_88,(fd_set *)0x0,&local_98);
    bVar1 = 0 < iVar3;
  }
  return bVar1;
}

Assistant:

bool blc::network::SSLSocket::writable() const {
	fd_set fds;
	struct timeval timeout = {0, 0};

	if (this->_opened == false)
		return (false);
	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, 0, &fds, 0, &timeout) <= 0)
		return (false);
	return (true);
}